

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::copy
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined4 uVar1;
  size_type sVar2;
  byte *pbVar3;
  byte *pbVar4;
  pointer pCVar5;
  pointer pCVar6;
  int iVar7;
  byte *pbVar8;
  
  sVar2 = this->len;
  if (sVar2 == 0) {
    return 0;
  }
  pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 3U & 0xfffffffffffffffc);
  pbVar4 = pbVar3 + sVar2 * 8;
  if (*(byte **)(dst + 8) < pbVar4) {
    pbVar3 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar2 << 3,4);
    sVar2 = this->len;
    if (sVar2 == 0) goto LAB_0056946b;
    pCVar5 = this->data_;
    pCVar6 = pCVar5 + sVar2;
    pbVar4 = pbVar3 + sVar2 * 8;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar4;
    pCVar5 = this->data_;
    pCVar6 = pCVar5 + sVar2;
  }
  iVar7 = 0;
  pbVar8 = pbVar3;
  do {
    uVar1 = pCVar5->value;
    *pbVar8 = 1;
    *(undefined4 *)(pbVar8 + 4) = uVar1;
    iVar7 = iVar7 + -1;
    if (pCVar5 + 1 == pCVar6) break;
    pbVar8 = pbVar8 + 8;
    pCVar5 = pCVar5 + 1;
  } while (pbVar8 != pbVar4);
  (anonymous_namespace)::Constructable::numConstructorCalls =
       (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
  (anonymous_namespace)::Constructable::numCopyConstructorCalls =
       (anonymous_namespace)::Constructable::numCopyConstructorCalls - iVar7;
LAB_0056946b:
  return (int)pbVar3;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }